

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O0

Fad<double> * __thiscall
Fad<double>::operator-=
          (Fad<double> *this,
          FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
          *x)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  double *pdVar4;
  Fad<double> *in_RDI;
  value_type vVar5;
  Vector<double> *unaff_retaddr;
  int i_3;
  int i_2;
  double *dxp_1;
  int i_1;
  int i;
  double *dxp;
  int sz;
  int xsz;
  int in_stack_ffffffffffffffbc;
  int local_38;
  int local_34;
  int local_28;
  int local_24;
  Fad<double> *pFVar6;
  int ssize;
  
  pFVar6 = in_RDI;
  iVar2 = FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
          ::size((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                  *)0x1665782);
  ssize = (int)((ulong)pFVar6 >> 0x20);
  iVar3 = Vector<double>::size((Vector<double> *)0x1665794);
  if (iVar2 != 0) {
    if (iVar3 == 0) {
      Vector<double>::resize(unaff_retaddr,ssize);
      pdVar4 = Vector<double>::begin(&in_RDI->dx_);
      bVar1 = FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
              ::hasFastAccess((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                               *)0x1665899);
      if (bVar1) {
        for (local_34 = 0; local_34 < iVar2; local_34 = local_34 + 1) {
          vVar5 = FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                  ::fastAccessDx((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                                  *)in_RDI,in_stack_ffffffffffffffbc);
          pdVar4[local_34] = -vVar5;
        }
      }
      else {
        for (local_38 = 0; local_38 < iVar2; local_38 = local_38 + 1) {
          vVar5 = FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                  ::dx((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                        *)in_RDI,in_stack_ffffffffffffffbc);
          pdVar4[local_38] = -vVar5;
        }
      }
    }
    else {
      pdVar4 = Vector<double>::begin(&in_RDI->dx_);
      bVar1 = FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
              ::hasFastAccess((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                               *)0x16657cb);
      if (bVar1) {
        for (local_24 = 0; local_24 < iVar3; local_24 = local_24 + 1) {
          vVar5 = FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                  ::fastAccessDx((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                                  *)in_RDI,in_stack_ffffffffffffffbc);
          pdVar4[local_24] = pdVar4[local_24] - vVar5;
        }
      }
      else {
        for (local_28 = 0; local_28 < iVar3; local_28 = local_28 + 1) {
          vVar5 = FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                  ::dx((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                        *)in_RDI,in_stack_ffffffffffffffbc);
          pdVar4[local_28] = pdVar4[local_28] - vVar5;
        }
      }
    }
  }
  vVar5 = FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
          ::val((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                 *)0x1665957);
  in_RDI->val_ = in_RDI->val_ - vVar5;
  return in_RDI;
}

Assistant:

inline  Fad<T> & Fad<T>::operator-= (const FadExpr<ExprT>& x)
{
  int xsz = x.size(), sz = dx_.size();

  if (xsz) {
    if (sz) {
      T* RESTRICT dxp = dx_.begin();
      if (x.hasFastAccess())
	for(int i=0; i<sz; ++i)
	  dxp[i] -= x.fastAccessDx(i);
      else
	for (int i=0; i<sz; ++i)
	  dxp[i] -= x.dx(i);
    }
    else {
      dx_.resize(xsz);
      T* RESTRICT dxp = dx_.begin();
      if (x.hasFastAccess())
	for(int i=0; i<xsz; ++i)
	  dxp[i] = -x.fastAccessDx(i);
      else
	for (int i=0; i<xsz; ++i)
	  dxp[i] = -x.dx(i);
    }
  }

  val_ -= x.val();


  return *this;
}